

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int luv_tcp_keepalive(lua_State *L)

{
  int iVar1;
  uv_tcp_t *handle_00;
  lua_Integer lVar2;
  undefined4 local_2c;
  uint delay;
  int enable;
  int ret;
  uv_tcp_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_tcp(L,1);
  local_2c = 0;
  luaL_checktype(L,2,1);
  iVar1 = lua_toboolean(L,2);
  if (iVar1 != 0) {
    lVar2 = luaL_checkinteger(L,3);
    local_2c = (uint)lVar2;
  }
  iVar1 = uv_tcp_keepalive(handle_00,iVar1,local_2c);
  if (iVar1 < 0) {
    L_local._4_4_ = luv_error(L,iVar1);
  }
  else {
    lua_pushinteger(L,(long)iVar1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_tcp_keepalive(lua_State* L) {
  uv_tcp_t* handle = luv_check_tcp(L, 1);
  int ret, enable;
  unsigned int delay = 0;
  luaL_checktype(L, 2, LUA_TBOOLEAN);
  enable = lua_toboolean(L, 2);
  if (enable) {
    delay = luaL_checkinteger(L, 3);
  }
  ret = uv_tcp_keepalive(handle, enable, delay);
  return luv_result(L, ret);
}